

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.h
# Opt level: O2

void __thiscall
cbtBvhSubtreeInfo::setAabbFromQuantizeNode
          (cbtBvhSubtreeInfo *this,cbtQuantizedBvhNode *quantizedNode)

{
  this->m_quantizedAabbMin[0] = quantizedNode->m_quantizedAabbMin[0];
  this->m_quantizedAabbMin[1] = quantizedNode->m_quantizedAabbMin[1];
  this->m_quantizedAabbMin[2] = quantizedNode->m_quantizedAabbMin[2];
  this->m_quantizedAabbMax[0] = quantizedNode->m_quantizedAabbMax[0];
  this->m_quantizedAabbMax[1] = quantizedNode->m_quantizedAabbMax[1];
  this->m_quantizedAabbMax[2] = quantizedNode->m_quantizedAabbMax[2];
  return;
}

Assistant:

void setAabbFromQuantizeNode(const cbtQuantizedBvhNode& quantizedNode)
	{
		m_quantizedAabbMin[0] = quantizedNode.m_quantizedAabbMin[0];
		m_quantizedAabbMin[1] = quantizedNode.m_quantizedAabbMin[1];
		m_quantizedAabbMin[2] = quantizedNode.m_quantizedAabbMin[2];
		m_quantizedAabbMax[0] = quantizedNode.m_quantizedAabbMax[0];
		m_quantizedAabbMax[1] = quantizedNode.m_quantizedAabbMax[1];
		m_quantizedAabbMax[2] = quantizedNode.m_quantizedAabbMax[2];
	}